

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O3

_Bool borg_wear_rings(void)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  wchar_t wVar4;
  int32_t iVar5;
  char *what;
  borg_item_conflict *pbVar6;
  borg_item_conflict *pbVar7;
  angband_constants *paVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  wVar4 = borg_first_empty_inventory_slot();
  if (wVar4 != L'\xffffffff') {
    uVar1 = z_info->pack_size;
    uVar11 = (ulong)uVar1;
    if ((((borg_items[uVar11 + 3].iqty == '\0') && (borg_items[uVar11 + 2].iqty == '\0')) &&
        (wVar4 + L'\x01' < (int)((uint)uVar1 - borg.trait[0x9e]))) &&
       (((borg_items[wVar4 + L'\x01'].iqty == '\0' && (borg.trait[0x6d] == 0)) &&
        (borg.trait[0x6c] == 0)))) {
      iVar9 = 0;
      if (uVar1 == 0 || 2000 < borg_t - borg_began) {
        return false;
      }
      uVar12 = 0xffffffff;
      lVar10 = 0x84;
      uVar13 = 0;
      bVar2 = false;
      pbVar6 = borg_items;
      paVar8 = z_info;
      do {
        pbVar7 = pbVar6;
        if (((pbVar6->desc[lVar10 + -0x20] != '\0') && (pbVar6->desc[lVar10 + -0x26] == '\x01')) &&
           (((*(int *)(pbVar6->desc + lVar10) != 0 &&
             ((((player->opts).opt[0x1e] != true || (pbVar6->desc[lVar10 + -0x28] != '\0')) ||
              (pbVar6->desc[lVar10 + -0x1c] == '\0')))) && (pbVar6->desc[lVar10 + -0x24] == '\x15'))
           )) {
          memcpy(pbVar6 + uVar11 + 3,(void *)((long)pbVar6 + lVar10 + -0x84),0x388);
          borg_items[(ulong)z_info->pack_size + 3].iqty = '\x01';
          pbVar6->desc[lVar10 + -0x20] = pbVar6->desc[lVar10 + -0x20] + -1;
          borg_notice(true);
          iVar5 = borg_power();
          pbVar7 = borg_items;
          paVar8 = z_info;
          iVar3 = borg.power * 2;
          if (pbVar6->desc[lVar10 + -0x14] == '\0') {
            iVar3 = iVar5;
          }
          borg_items[(ulong)z_info->pack_size + 3].iqty = '\0';
          pbVar6->desc[lVar10 + -0x20] = pbVar6->desc[lVar10 + -0x20] + '\x01';
          bVar2 = iVar9 <= iVar3;
          if ((int)uVar12 < 0 || bVar2) {
            iVar9 = iVar3;
          }
          if ((int)uVar12 < 0 || bVar2) {
            uVar12 = (uint)uVar13;
          }
          bVar2 = true;
        }
        uVar13 = uVar13 + 1;
        uVar11 = (ulong)paVar8->pack_size;
        lVar10 = lVar10 + 0x388;
        pbVar6 = pbVar7;
      } while (uVar13 < uVar11);
      if (bVar2) {
        borg_notice(true);
      }
      if ((int)uVar12 < 0) {
        return false;
      }
      if (iVar9 <= borg.power) {
        return false;
      }
      pbVar6 = borg_items + uVar12;
      borg_note("# Putting on best tight ring.");
      what = format("# Wearing %s.",pbVar6);
      borg_note(what);
      borg_keypress(0x77);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar12]);
      borg.time_this_panel = borg.time_this_panel + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_wear_rings(void)
{
    int hole = borg_first_empty_inventory_slot();

    int32_t p, b_p = 0L;

    int i, b_i     = -1;

    borg_item *item;

    bool fix = false;

    if (hole == -1)
        return false;

    /* Require no rings */
    if (borg_items[INVEN_LEFT].iqty)
        return false;
    if (borg_items[INVEN_RIGHT].iqty)
        return false;

    /* Require two empty slots */
    if (hole + 1 >= PACK_SLOTS)
        return false;
    if (borg_items[hole + 1].iqty)
        return false;

    /* hack prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 2000)
        return false;

    /* Scan inventory */
    for (i = 0; i < z_info->pack_size; i++) {
        item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require aware */
        if (!item->aware)
            continue;

        /* Hack -- ignore "worthless" items */
        if (!item->value)
            continue;

        /* skip artifact rings not star id'd  */
        if (OPT(player, birth_randarts) && !item->ident && item->art_idx)
            continue;

        /* Only process "rings" */
        if (item->tval != TV_RING)
            continue;

        /* Wear new item */
        memcpy(&borg_items[INVEN_LEFT], item, sizeof(borg_item));

        /* Only a single item */
        borg_items[INVEN_LEFT].iqty = 1;

        /* Reduce the inventory quantity by one */
        item->iqty--;

        /* Fix later */
        fix = true;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the inventory */
        p = borg_power();

        /* the One Ring would be awesome */
        if (item->one_ring)
            p = borg.power * 2;

        /* Restore the old item (empty) */
        borg_items[INVEN_LEFT].iqty = 0;

        /* Restore the item in inventory */
        item->iqty++;

        /* Ignore "bad" swaps */
        if ((b_i >= 0) && (p < b_p))
            continue;

        /* Maintain the "best" */
        b_i = i;
        b_p = p;
    }

    /* Restore bonuses */
    if (fix)
        borg_notice(true);

    /* No item */
    if ((b_i >= 0) && (b_p > borg.power)) {
        /* Get the item */
        item = &borg_items[b_i];

        /* Log */
        borg_note("# Putting on best tight ring.");

        /* Log */
        borg_note(format("# Wearing %s.", item->desc));

        /* Wear it */
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[b_i]);

        /* Did something */
        borg.time_this_panel++;
        return true;
    }

    /* Nope */
    return false;
}